

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

QDebug operator<<(QDebug d,QAction *action)

{
  int t;
  long lVar1;
  undefined7 uVar2;
  qsizetype qVar3;
  QDebug *pQVar4;
  char *t_00;
  QAction *in_RDX;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  QArrayDataPointer<QKeySequence> local_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)action);
  *(undefined1 *)(*(long *)action + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)action,"QAction(");
  QDebug::operator<<(pQVar4,in_RDX);
  if (in_RDX != (QAction *)0x0) {
    pQVar4 = QDebug::operator<<((QDebug *)action," text=");
    QAction::text((QString *)&local_58,in_RDX);
    QDebug::operator<<(pQVar4,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QAction::toolTip((QString *)&local_58,in_RDX);
    qVar3 = local_58.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    if (qVar3 != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)action," toolTip=");
      QAction::toolTip((QString *)&local_58,in_RDX);
      QDebug::operator<<(pQVar4,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    if ((*(byte *)(*(long *)&in_RDX->field_0x8 + 0x188) & 0x20) != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)action," checked=");
      QDebug::operator<<(pQVar4,(~*(uint *)(*(long *)&in_RDX->field_0x8 + 0x188) & 0x60) == 0);
    }
    QAction::shortcuts((QList<QKeySequence> *)&local_58,in_RDX);
    QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_58);
    if (local_58.size != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)action," shortcuts=");
      local_68._0_8_ = pQVar4->stream;
      ((Stream *)local_68._0_8_)->ref = ((Stream *)local_68._0_8_)->ref + 1;
      QAction::shortcuts((QList<QKeySequence> *)&local_58,in_RDX);
      operator<<((Stream *)(local_68 + 8),(QList<QKeySequence> *)local_68);
      QDebug::~QDebug((QDebug *)(local_68 + 8));
      QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_58);
      QDebug::~QDebug((QDebug *)local_68);
    }
    QDebug::operator<<((QDebug *)action," menuRole=");
    t = *(int *)(*(long *)&in_RDX->field_0x8 + 0x18c);
    QMetaObject::indexOfEnumerator((char *)&QAction::staticMetaObject);
    local_58._0_16_ = QMetaObject::enumerator(0x789780);
    t_00 = (char *)QMetaEnum::valueToKey((ulonglong)&local_58);
    if (t_00 == (char *)0x0) {
      QDebug::operator<<((QDebug *)action,t);
    }
    else {
      QDebug::operator<<((QDebug *)action,t_00);
    }
    pQVar4 = QDebug::operator<<((QDebug *)action," enabled=");
    QDebug::operator<<(pQVar4,(bool)((byte)*(undefined2 *)(*(long *)&in_RDX->field_0x8 + 0x188) & 1)
                      );
    pQVar4 = QDebug::operator<<((QDebug *)action," visible=");
    QDebug::operator<<(pQVar4,SUB41((*(ushort *)(*(long *)&in_RDX->field_0x8 + 0x188) & 8) >> 3,0));
  }
  QDebug::operator<<((QDebug *)action,')');
  uVar2 = *(undefined7 *)&action->field_0x1;
  *(undefined8 *)action = 0;
  (d.stream)->ts = (QTextStream)action->super_QObject;
  *(undefined7 *)&(d.stream)->field_0x1 = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAction *action)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QAction(" << static_cast<const void *>(action);
    if (action) {
        d << " text=" << action->text();
        if (!action->toolTip().isEmpty())
            d << " toolTip=" << action->toolTip();
        if (action->isCheckable())
            d << " checked=" << action->isChecked();
#if QT_CONFIG(shortcut)
        if (!action->shortcuts().isEmpty())
            d << " shortcuts=" << action->shortcuts();
#endif
        d << " menuRole=";
        QtDebugUtils::formatQEnum(d, action->menuRole());
        d << " enabled=" << action->isEnabled();
        d << " visible=" << action->isVisible();
    }
    d << ')';
    return d;
}